

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_buf.c
# Opt level: O0

ngx_chain_t * ngx_chain_update_sent(ngx_chain_t *in,off_t sent)

{
  long local_28;
  off_t size;
  off_t sent_local;
  ngx_chain_t *in_local;
  
  size = sent;
  sent_local = (off_t)in;
  do {
    if (sent_local == 0) {
      return (ngx_chain_t *)0x0;
    }
    if (((((*(ushort *)(*(long *)sent_local + 0x48) >> 5 & 1) == 0) &&
         ((*(ushort *)(*(long *)sent_local + 0x48) >> 7 & 1) == 0)) &&
        ((*(ushort *)(*(long *)sent_local + 0x48) >> 6 & 1) == 0)) ||
       ((((*(ushort *)(*(long *)sent_local + 0x48) & 1) != 0 ||
         ((*(ushort *)(*(long *)sent_local + 0x48) >> 1 & 1) != 0)) ||
        (((*(ushort *)(*(long *)sent_local + 0x48) >> 2 & 1) != 0 ||
         ((*(ushort *)(*(long *)sent_local + 0x48) >> 4 & 1) != 0)))))) {
      if (size == 0) {
        return (ngx_chain_t *)sent_local;
      }
      if ((((*(ushort *)(*(long *)sent_local + 0x48) & 1) == 0) &&
          ((*(ushort *)(*(long *)sent_local + 0x48) >> 1 & 1) == 0)) &&
         ((*(ushort *)(*(long *)sent_local + 0x48) >> 2 & 1) == 0)) {
        local_28 = *(long *)(*(long *)sent_local + 0x18) - *(long *)(*(long *)sent_local + 0x10);
      }
      else {
        local_28 = *(long *)(*(long *)sent_local + 8) - **(long **)sent_local;
      }
      if (size < local_28) {
        if ((((*(ushort *)(*(long *)sent_local + 0x48) & 1) != 0) ||
            ((*(ushort *)(*(long *)sent_local + 0x48) >> 1 & 1) != 0)) ||
           ((*(ushort *)(*(long *)sent_local + 0x48) >> 2 & 1) != 0)) {
          **(long **)sent_local = size + **(long **)sent_local;
        }
        if ((*(ushort *)(*(long *)sent_local + 0x48) >> 4 & 1) == 0) {
          return (ngx_chain_t *)sent_local;
        }
        *(off_t *)(*(long *)sent_local + 0x10) = size + *(long *)(*(long *)sent_local + 0x10);
        return (ngx_chain_t *)sent_local;
      }
      size = size - local_28;
      if ((((*(ushort *)(*(long *)sent_local + 0x48) & 1) != 0) ||
          ((*(ushort *)(*(long *)sent_local + 0x48) >> 1 & 1) != 0)) ||
         ((*(ushort *)(*(long *)sent_local + 0x48) >> 2 & 1) != 0)) {
        **(undefined8 **)sent_local = *(undefined8 *)(*(long *)sent_local + 8);
      }
      if ((*(ushort *)(*(long *)sent_local + 0x48) >> 4 & 1) != 0) {
        *(undefined8 *)(*(long *)sent_local + 0x10) = *(undefined8 *)(*(long *)sent_local + 0x18);
      }
    }
    sent_local = *(off_t *)(sent_local + 8);
  } while( true );
}

Assistant:

ngx_chain_t *
ngx_chain_update_sent(ngx_chain_t *in, off_t sent)
{
    off_t  size;

    for ( /* void */ ; in; in = in->next) {

        if (ngx_buf_special(in->buf)) {
            continue;
        }

        if (sent == 0) {
            break;
        }

        size = ngx_buf_size(in->buf);

        if (sent >= size) {
            sent -= size;

            if (ngx_buf_in_memory(in->buf)) {
                in->buf->pos = in->buf->last;
            }

            if (in->buf->in_file) {
                in->buf->file_pos = in->buf->file_last;
            }

            continue;
        }

        if (ngx_buf_in_memory(in->buf)) {
            in->buf->pos += (size_t) sent;
        }

        if (in->buf->in_file) {
            in->buf->file_pos += sent;
        }

        break;
    }

    return in;
}